

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshSceneNode.cpp
# Opt level: O1

void __thiscall irr::scene::CMeshSceneNode::render(CMeshSceneNode *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  long *plVar7;
  undefined4 extraout_var;
  undefined8 *puVar9;
  long lVar10;
  undefined4 extraout_var_01;
  undefined8 uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  SMaterial m;
  undefined8 uStack_f0;
  SMaterial local_e8;
  float *pfVar8;
  undefined4 extraout_var_00;
  
  plVar7 = (long *)(**(code **)(**(long **)&this->field_0xc8 + 0x10))();
  if ((plVar7 != (long *)0x0) && (this->Mesh != (IMesh *)0x0)) {
    uStack_f0._4_4_ = (**(code **)(**(long **)&this->field_0xc8 + 0xe0))();
    this->PassCount = this->PassCount + 1;
    (**(code **)(*plVar7 + 0x30))(plVar7,1,&this->field_0x30);
    iVar5 = (*this->Mesh->_vptr_IMesh[3])();
    pfVar8 = (float *)CONCAT44(extraout_var,iVar5);
    fVar1 = pfVar8[1];
    fVar2 = pfVar8[2];
    fVar3 = pfVar8[3];
    (this->Box).MinEdge.X = *pfVar8;
    (this->Box).MinEdge.Y = fVar1;
    (this->Box).MinEdge.Z = fVar2;
    (this->Box).MaxEdge.X = fVar3;
    fVar1 = pfVar8[5];
    (this->Box).MaxEdge.Y = pfVar8[4];
    (this->Box).MaxEdge.Z = fVar1;
    iVar5 = (**this->Mesh->_vptr_IMesh)();
    if (iVar5 != 0) {
      lVar13 = 0;
      uVar14 = 0;
      do {
        iVar5 = (*this->Mesh->_vptr_IMesh[1])(this->Mesh,uVar14 & 0xffffffff);
        puVar9 = (undefined8 *)CONCAT44(extraout_var_00,iVar5);
        if (puVar9 != (undefined8 *)0x0) {
          if (this->ReadOnlyMaterials == true) {
            lVar10 = (**(code **)*puVar9)(puVar9);
          }
          else {
            lVar10 = (long)&((this->Materials).m_data.
                             super__Vector_base<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>
                             ._M_impl.super__Vector_impl_data._M_start)->TextureLayers[0].Texture +
                     lVar13;
          }
          bVar15 = uStack_f0._4_4_ != 0x10;
          cVar4 = (**(code **)(*plVar7 + 0x338))(plVar7,lVar10);
          if (bVar15 != (bool)cVar4) {
            (**(code **)(*plVar7 + 0x60))(plVar7,lVar10);
            (**(code **)(*plVar7 + 0x1b0))(plVar7,puVar9);
          }
        }
        uVar14 = uVar14 + 1;
        uVar6 = (**this->Mesh->_vptr_IMesh)();
        lVar13 = lVar13 + 0xb8;
      } while (uVar14 < uVar6);
    }
    if ((*(int *)&this->field_0xd8 != 0) && (this->PassCount == 1)) {
      video::SMaterial::SMaterial(&local_e8);
      local_e8._176_1_ = local_e8._176_1_ & 0xf7;
      local_e8.AntiAliasing = '\0';
      (**(code **)(*plVar7 + 0x60))(plVar7,&local_e8);
      if ((this->field_0xd8 & 1) != 0) {
        (**(code **)(*plVar7 + 0x170))(plVar7,&this->Box,0xffffffff);
      }
      if ((this->field_0xd8 & 0x20) != 0) {
        iVar5 = (**this->Mesh->_vptr_IMesh)();
        if (iVar5 != 0) {
          uVar14 = 0;
          do {
            iVar5 = (*this->Mesh->_vptr_IMesh[1])(this->Mesh,uVar14);
            uVar11 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x50))
                               ((long *)CONCAT44(extraout_var_01,iVar5));
            (**(code **)(*plVar7 + 0x170))(plVar7,uVar11,0xffbe8080);
            uVar12 = (int)uVar14 + 1;
            uVar14 = (ulong)uVar12;
            uVar6 = (**this->Mesh->_vptr_IMesh)();
          } while (uVar12 < uVar6);
        }
      }
      if ((this->field_0xd8 & 2) != 0) {
        uVar6 = (**this->Mesh->_vptr_IMesh)();
        if (uVar6 != 0) {
          uVar14 = 0;
          do {
            iVar5 = (*this->Mesh->_vptr_IMesh[1])(this->Mesh,uVar14);
            (**(code **)(*plVar7 + 0x1b8))(0x3f800000,plVar7,iVar5,0xff22dddd);
            uVar12 = (int)uVar14 + 1;
            uVar14 = (ulong)uVar12;
          } while (uVar6 != uVar12);
        }
      }
      if ((this->field_0xd8 & 8) != 0) {
        local_e8._176_1_ = local_e8._176_1_ | 1;
        (**(code **)(*plVar7 + 0x60))(plVar7);
        iVar5 = (**this->Mesh->_vptr_IMesh)();
        if (iVar5 != 0) {
          uVar6 = 0;
          do {
            iVar5 = (*this->Mesh->_vptr_IMesh[1])(this->Mesh,(ulong)uVar6);
            (**(code **)(*plVar7 + 0x1b0))(plVar7,iVar5);
            uVar6 = uVar6 + 1;
            uVar12 = (**this->Mesh->_vptr_IMesh)();
          } while (uVar6 < uVar12);
        }
      }
      lVar13 = 0x80;
      do {
        if (*(void **)((long)&uStack_f0 + lVar13) != (void *)0x0) {
          operator_delete(*(void **)((long)&uStack_f0 + lVar13),0x40);
        }
        lVar13 = lVar13 + -0x20;
      } while (lVar13 != 0);
    }
  }
  return;
}

Assistant:

void CMeshSceneNode::render()
{
	video::IVideoDriver *driver = SceneManager->getVideoDriver();

	if (!Mesh || !driver)
		return;

	const bool isTransparentPass =
			SceneManager->getSceneNodeRenderPass() == scene::ESNRP_TRANSPARENT;

	++PassCount;

	driver->setTransform(video::ETS_WORLD, AbsoluteTransformation);
	Box = Mesh->getBoundingBox();

	for (u32 i = 0; i < Mesh->getMeshBufferCount(); ++i) {
		scene::IMeshBuffer *mb = Mesh->getMeshBuffer(i);
		if (mb) {
			const video::SMaterial &material = ReadOnlyMaterials ? mb->getMaterial() : Materials[i];

			const bool transparent = driver->needsTransparentRenderPass(material);

			// only render transparent buffer if this is the transparent render pass
			// and solid only in solid pass
			if (transparent == isTransparentPass) {
				driver->setMaterial(material);
				driver->drawMeshBuffer(mb);
			}
		}
	}

	// for debug purposes only:
	if (DebugDataVisible && PassCount == 1) {
		video::SMaterial m;
		m.Lighting = false;
		m.AntiAliasing = 0;
		driver->setMaterial(m);

		if (DebugDataVisible & scene::EDS_BBOX) {
			driver->draw3DBox(Box, video::SColor(255, 255, 255, 255));
		}
		if (DebugDataVisible & scene::EDS_BBOX_BUFFERS) {
			for (u32 g = 0; g < Mesh->getMeshBufferCount(); ++g) {
				driver->draw3DBox(
						Mesh->getMeshBuffer(g)->getBoundingBox(),
						video::SColor(255, 190, 128, 128));
			}
		}

		if (DebugDataVisible & scene::EDS_NORMALS) {
			// draw normals
			const f32 debugNormalLength = 1.f;
			const video::SColor debugNormalColor = video::SColor(255, 34, 221, 221);
			const u32 count = Mesh->getMeshBufferCount();

			for (u32 i = 0; i != count; ++i) {
				driver->drawMeshBufferNormals(Mesh->getMeshBuffer(i), debugNormalLength, debugNormalColor);
			}
		}

		// show mesh
		if (DebugDataVisible & scene::EDS_MESH_WIRE_OVERLAY) {
			m.Wireframe = true;
			driver->setMaterial(m);

			for (u32 g = 0; g < Mesh->getMeshBufferCount(); ++g) {
				driver->drawMeshBuffer(Mesh->getMeshBuffer(g));
			}
		}
	}
}